

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O1

int InsertAVL(BiTree *T,int data,int *taller)

{
  int iVar1;
  BiTree pBVar2;
  int iVar3;
  
  pBVar2 = *T;
  if (pBVar2 == (BiTree)0x0) {
    pBVar2 = (BiTree)malloc(0x18);
    *T = pBVar2;
    *(undefined8 *)&pBVar2->bf = 0;
    *(undefined8 *)((long)&pBVar2->lchild + 4) = 0;
    *(undefined4 *)((long)&pBVar2->rchlid + 4) = 0;
    pBVar2->data = data;
    iVar3 = 1;
    goto LAB_001012cf;
  }
  iVar3 = 0;
  if (pBVar2->data != data) {
    if (data < pBVar2->data) {
      iVar1 = InsertAVL(&pBVar2->lchild,data,taller);
      if (iVar1 != 0) {
        if (*taller == 0) {
          return 1;
        }
        pBVar2 = *T;
        iVar1 = pBVar2->bf;
        if (iVar1 == -1) {
LAB_00101352:
          iVar1 = 1;
          pBVar2->bf = 0;
          goto LAB_001012d4;
        }
        if (iVar1 == 0) {
          pBVar2->bf = 1;
LAB_0010136e:
          iVar1 = 1;
          iVar3 = 1;
          goto LAB_001012d4;
        }
        if (iVar1 != 1) {
          return 1;
        }
        LeftBalance(T);
        iVar3 = 0;
LAB_001012cf:
        iVar1 = 1;
        goto LAB_001012d4;
      }
    }
    else {
      iVar1 = InsertAVL(&pBVar2->rchlid,data,taller);
      if (iVar1 != 0) {
        if (*taller == 0) {
          return 1;
        }
        pBVar2 = *T;
        iVar1 = pBVar2->bf;
        if (iVar1 != -1) {
          if (iVar1 == 0) {
            pBVar2->bf = -1;
            goto LAB_0010136e;
          }
          if (iVar1 != 1) {
            return 1;
          }
          goto LAB_00101352;
        }
        RightBalance(T);
        iVar3 = 0;
        goto LAB_001012cf;
      }
    }
  }
  iVar1 = 0;
LAB_001012d4:
  *taller = iVar3;
  return iVar1;
}

Assistant:

int InsertAVL(BiTree *T,int data,int *taller)
{
    if(*T == NULL)  //找到插入位置
    {
        *T = (BiTree)malloc(sizeof(BiTNode));
        (*T)->bf = EH;
        (*T)->rchlid = (*T)->lchild = NULL;
        (*T)->data = data;
        *taller = true;
    }
    else
    {
        if(data == (*T)->data)  //树中有相同的结点数据直接返回
        {
            *taller = false;
            return false;
        }
        if(data < (*T)->data)   //往左子树搜索进行插入
        {
            if(!InsertAVL(&(*T)->lchild,data,taller))   //树中有相同的结点
            {
                *taller = false;
                return false;
            }
            if (*taller)
            {
                switch ((*T)->bf)               //T插入结点后，检测平衡因子，根据情况，做相应的修改和旋转
                {
                    case LH:
                        LeftBalance(T);             //插入后左边不平衡了，让其左平衡
                        *taller = false;
                        break;
                    case EH:
                        (*T)->bf = LH;
                        *taller = true;
                        break;
                    case RH:
                        (*T)->bf = EH;
                        *taller = false;
                        break;
                }
            }
        }
        else                    //往右子树搜索进行插入
        {
            if(!InsertAVL(&(*T)->rchlid,data,taller))      //树中有相同的结点
            {
                *taller = false;
                return false;
            }
            if (*taller)        //插入到右子树中且长高了
            {
                switch ((*T)->bf)                       //T插入结点后，检测平衡因子，根据情况，做相应的修改和旋转
                {
                    case LH:
                        (*T)->bf = EH;
                        *taller = false;
                        break;
                    case EH:
                        (*T)->bf = RH;
                        *taller = true;
                        break;
                    case RH:
                        RightBalance(T);                       //插入后右边不平衡了，让其右平衡
                        *taller = false;
                        break;
                }
            }
        }
    }
    return true;
}